

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O3

void template_clear(void)

{
  void *__ptr;
  int line;
  
  if (0 < template_browser->lines) {
    line = 0;
    do {
      line = line + 1;
      __ptr = Fl_Browser::data(template_browser,line);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
    } while (line < template_browser->lines);
  }
  Fl_Browser_::deselect(&template_browser->super_Fl_Browser_,0);
  Fl_Browser::clear(template_browser);
  return;
}

Assistant:

void template_clear() {
  int i;
  void *filename;
  
  for (i = 1; i <= template_browser->size(); i ++) {
    if ((filename = template_browser->data(i)) != NULL) free(filename);
  }
  
  template_browser->deselect();
  template_browser->clear();
}